

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O3

QString * __thiscall
ExportDirWrapper::getFieldName
          (QString *__return_storage_ptr__,ExportDirWrapper *this,size_t fieldId)

{
  Executable *pEVar1;
  PEFile *this_00;
  storage_type *psVar2;
  QByteArrayView QVar3;
  Data *local_28;
  char16_t *pcStack_20;
  qsizetype local_18;
  
  switch(fieldId) {
  case 0:
    psVar2 = (storage_type *)0xf;
    break;
  case 1:
    pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    if ((pEVar1 != (Executable *)0x0) &&
       (this_00 = (PEFile *)__dynamic_cast(pEVar1,&Executable::typeinfo,&PEFile::typeinfo,0),
       this_00 != (PEFile *)0x0)) {
      PEFile::isReproBuild(this_00);
    }
    goto LAB_00132f22;
  case 2:
    goto LAB_00132e7b;
  case 3:
LAB_00132e7b:
    psVar2 = (storage_type *)0xc;
    break;
  case 4:
    goto LAB_00132ed3;
  case 5:
LAB_00132ed3:
    psVar2 = (storage_type *)0x4;
    break;
  case 6:
    psVar2 = (storage_type *)0x11;
    break;
  case 7:
LAB_00132f22:
    psVar2 = (storage_type *)0xd;
    break;
  case 8:
    psVar2 = (storage_type *)0x12;
    break;
  case 9:
    psVar2 = (storage_type *)0xe;
    break;
  case 10:
    psVar2 = (storage_type *)0x15;
    break;
  default:
    (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
      super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xe])
              (__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  QVar3.m_data = psVar2;
  QVar3.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar3);
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = pcStack_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

QString ExportDirWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
        case CHARACTERISTIC: return "Characteristics";
        case TIMESTAMP: {
            PEFile* myPe = dynamic_cast<PEFile*>(this->m_Exe);
            if (myPe && myPe->isReproBuild()) {
                return "ReproChecksum";
            }
            return "TimeDateStamp";
        }
        case MAJOR_VER: return "MajorVersion";
        case MINOR_VER: return "MinorVersion";
        case NAME_RVA: return "Name";
        case BASE: return "Base";
        case FUNCTIONS_NUM: return "NumberOfFunctions";
        case NAMES_NUM: return "NumberOfNames";
        case FUNCTIONS_RVA: return "AddressOfFunctions";
        case FUNC_NAMES_RVA: return "AddressOfNames";
        case NAMES_ORDINALS_RVA: return "AddressOfNameOrdinals";
    }
    return getName();
}